

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_3,_0>
       ::run(redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *mat,
            scalar_sum_op<double,_double> *func)

{
  Scalar *pSVar1;
  Index index;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Scalar SVar6;
  Scalar SVar7;
  Scalar SVar8;
  Scalar SVar9;
  
  pSVar1 = (mat->m_evaluator).
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
           m_data;
  lVar4 = (mat->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_cols * (mat->m_xpr->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                   m_storage.m_rows;
  lVar2 = 4;
  if (lVar4 + 1U < 3) {
    SVar6 = *pSVar1;
    for (lVar2 = 1; lVar2 < lVar4; lVar2 = lVar2 + 1) {
      SVar6 = SVar6 + pSVar1[lVar2];
    }
  }
  else {
    lVar3 = (lVar4 / 2) * 2;
    SVar9 = *pSVar1;
    SVar6 = pSVar1[1];
    if (3 < lVar4) {
      lVar5 = (lVar4 / 4) * 4;
      SVar7 = pSVar1[2];
      SVar8 = pSVar1[3];
      for (; lVar2 < lVar5; lVar2 = lVar2 + 4) {
        SVar9 = SVar9 + pSVar1[lVar2];
        SVar6 = SVar6 + (pSVar1 + lVar2)[1];
        SVar7 = SVar7 + pSVar1[lVar2 + 2];
        SVar8 = SVar8 + (pSVar1 + lVar2 + 2)[1];
      }
      SVar9 = SVar9 + SVar7;
      SVar6 = SVar6 + SVar8;
      if (lVar5 < lVar3) {
        SVar9 = SVar9 + pSVar1[(lVar4 / 4) * 4];
        SVar6 = SVar6 + (pSVar1 + (lVar4 / 4) * 4)[1];
      }
    }
    SVar6 = SVar6 + SVar9;
    for (; lVar3 < lVar4; lVar3 = lVar3 + 1) {
      SVar6 = SVar6 + pSVar1[lVar3];
    }
  }
  return SVar6;
}

Assistant:

static Scalar run(const Derived &mat, const Func& func)
  {
    const Index size = mat.size();
    
    const Index packetSize = redux_traits<Func, Derived>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Derived::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Derived::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(mat.nestedExpression());
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = mat.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = mat.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, mat.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, mat.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,mat.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,mat.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = mat.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,mat.coeff(index));
    }

    return res;
  }